

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeCanonicalizer.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizer::DiagnosticsReporter::ExpectedTypedefDeclaration
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  SyntaxToken local_b8;
  DiagnosticDescriptor local_78;
  
  std::__cxx11::string::string(local_d8,(string *)&ID_of_ExpectedTypedefDeclaration_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"[[expected typedef declaration]]",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"expected `typedef\' declaration",&local_11a);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_78,local_d8,local_f8,local_118,2,3);
  local_b8.field_10 = tk->field_10;
  local_b8.tree_ = tk->tree_;
  local_b8.syntaxK_ = tk->syntaxK_;
  local_b8.byteSize_ = tk->byteSize_;
  local_b8.charSize_ = tk->charSize_;
  local_b8._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_b8.byteOffset_ = tk->byteOffset_;
  local_b8.charOffset_ = tk->charOffset_;
  local_b8.matchingBracket_ = tk->matchingBracket_;
  local_b8.field_7 = tk->field_7;
  local_b8._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_b8.lineno_ = tk->lineno_;
  local_b8.column_ = tk->column_;
  local_b8._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_78,&local_b8);
  SyntaxToken::~SyntaxToken(&local_b8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void TypeCanonicalizer::DiagnosticsReporter::ExpectedTypedefDeclaration(SyntaxToken tk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_ExpectedTypedefDeclaration,
                 "[[expected typedef declaration]]",
                 "expected `typedef' declaration",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeResolution),
             tk);
}